

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O0

void mult_matrix_vec(float *m,float *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float (*matrix) [4];
  float src [3];
  float W;
  float *v_local;
  float *m_local;
  
  fVar1 = *v;
  fVar2 = v[1];
  fVar3 = v[2];
  fVar4 = fVar3 * m[0xe] + fVar1 * m[0xc] + fVar2 * m[0xd] + m[0xf];
  if (ABS(fVar4) <= 1.1920929e-07) {
    W = 1.0;
  }
  else {
    W = 1.0 / fVar4;
  }
  *v = (fVar3 * m[2] + fVar1 * *m + fVar2 * m[1] + m[3]) * W;
  v[1] = (fVar3 * m[6] + fVar1 * m[4] + fVar2 * m[5] + m[7]) * W;
  v[2] = (fVar3 * m[10] + fVar1 * m[8] + fVar2 * m[9] + m[0xb]) * W;
  return;
}

Assistant:

static void
mult_matrix_vec(float *m, float *v)
{
  float W;
  float src[3];
  float (*matrix)[4];

  matrix = (float (*)[4]) m;

  src[0] = v[0];
  src[1] = v[1];
  src[2] = v[2];

  W =
    src[0]*matrix[3][0]+
    src[1]*matrix[3][1]+
    src[2]*matrix[3][2]+
    matrix[3][3];

  if (fabs(W) > FLT_EPSILON) W = 1.0f / W;
  else W = 1.0f;

  v[0] =
    (src[0]*matrix[0][0]+
     src[1]*matrix[0][1]+
     src[2]*matrix[0][2]+
     matrix[0][3])*W;
  v[1] =
    (src[0]*matrix[1][0]+
     src[1]*matrix[1][1]+
     src[2]*matrix[1][2]+
     matrix[1][3])*W;
  v[2] =
    (src[0]*matrix[2][0]+
     src[1]*matrix[2][1]+
     src[2]*matrix[2][2]+
     matrix[2][3])*W;
}